

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint __fd;
  int __fd_00;
  int iVar4;
  mode_t perm;
  string real_destination;
  string destination_dir;
  ifstream fin;
  size_type local_1428;
  byte abStack_1410 [488];
  ofstream fout;
  string source_name;
  
  bVar2 = SameFile(source,destination);
  if (bVar2) {
    return true;
  }
  perm = 0;
  bVar2 = GetPermissions(source,&perm);
  std::__cxx11::string::string((string *)&real_destination,(string *)destination);
  bVar3 = FileIsDirectory(source);
  if (bVar3) {
    MakeDirectory(destination,(mode_t *)0x0);
  }
  else {
    destination_dir._M_dataplus._M_p = (pointer)&destination_dir.field_2;
    destination_dir._M_string_length = 0;
    destination_dir.field_2._M_local_buf[0] = '\0';
    bVar3 = FileIsDirectory(destination);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&destination_dir);
      ConvertToUnixSlashes(&real_destination);
      std::__cxx11::string::push_back((char)&real_destination);
      std::__cxx11::string::string((string *)&source_name,(string *)source);
      GetFilenameName((string *)&fin,&source_name);
      std::__cxx11::string::append((string *)&real_destination);
      std::__cxx11::string::~string((string *)&fin);
    }
    else {
      GetFilenamePath(&source_name,destination);
      std::__cxx11::string::operator=((string *)&destination_dir,(string *)&source_name);
    }
    std::__cxx11::string::~string((string *)&source_name);
    MakeDirectory(&destination_dir,(mode_t *)0x0);
    __fd = open((source->_M_dataplus)._M_p,0);
    if ((int)__fd < 0) {
LAB_003171ad:
      std::ifstream::ifstream(&fin,(source->_M_dataplus)._M_p,_S_in|_S_bin);
      if ((abStack_1410[*(long *)(_fin + -0x18)] & 5) == 0) {
        RemoveFile(&real_destination);
        std::ofstream::ofstream(&fout,real_destination._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
        if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]]
            & 5) != 0) {
          std::ofstream::~ofstream(&fout);
          goto LAB_00317210;
        }
        while (((abStack_1410[*(long *)(_fin + -0x18)] & 5) == 0 &&
               (std::istream::read((char *)&fin,(long)&source_name), local_1428 != 0))) {
          std::ostream::write((char *)&fout,(long)&source_name);
        }
        std::ostream::flush();
        std::ifstream::close();
        std::ofstream::close();
        bVar1 = (&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
                [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                       [-3]];
        std::ofstream::~ofstream(&fout);
        std::ifstream::~ifstream(&fin);
        if ((bVar1 & 5) == 0) goto LAB_00317177;
      }
      else {
LAB_00317210:
        std::ifstream::~ifstream(&fin);
      }
      std::__cxx11::string::~string((string *)&destination_dir);
      bVar2 = false;
      goto LAB_00317226;
    }
    RemoveFile(&real_destination);
    __fd_00 = open(real_destination._M_dataplus._M_p,0x241,0x180);
    if (__fd_00 < 0) {
      close(__fd);
      goto LAB_003171ad;
    }
    iVar4 = ioctl(__fd_00,0x40049409,(ulong)__fd);
    close(__fd);
    close(__fd_00);
    if (iVar4 < 0) goto LAB_003171ad;
LAB_00317177:
    std::__cxx11::string::~string((string *)&destination_dir);
  }
  if (bVar2) {
    bVar2 = false;
    bVar3 = SetPermissions(&real_destination,perm,false);
    if (!bVar3) goto LAB_00317226;
  }
  bVar2 = true;
LAB_00317226:
  std::__cxx11::string::~string((string *)&real_destination);
  return bVar2;
}

Assistant:

bool SystemTools::CopyFileAlways(const std::string& source,
                                 const std::string& destination)
{
  // If files are the same do not copy
  if (SystemTools::SameFile(source, destination)) {
    return true;
  }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    SystemTools::MakeDirectory(destination);
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }

    // Create destination directory

    SystemTools::MakeDirectory(destination_dir);

    if (!CloneFileContent(source, real_destination)) {
      // if cloning did not succeed, fall back to blockwise copy
      if (!CopyFileContentBlockwise(source, real_destination)) {
        return false;
      }
    }
  }
  if (perms) {
    if (!SystemTools::SetPermissions(real_destination, perm)) {
      return false;
    }
  }
  return true;
}